

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O0

void __thiscall amrex::MLNodeLaplacian::prepareForSolve(MLNodeLaplacian *this)

{
  long in_RDI;
  MLNodeLaplacian *unaff_retaddr;
  MLNodeLaplacian *in_stack_00000080;
  MLNodeLinOp *in_stack_00000ab8;
  MLNodeLaplacian *in_stack_00005e28;
  
  MLNodeLinOp::prepareForSolve(&unaff_retaddr->super_MLNodeLinOp);
  MLNodeLinOp::buildMasks(in_stack_00000ab8);
  averageDownCoeffs(in_stack_00000080);
  buildIntegral(unaff_retaddr);
  if ((*(byte *)(in_RDI + 0x621) & 1) != 0) {
    buildSurfaceIntegral(unaff_retaddr);
  }
  buildStencil(in_stack_00005e28);
  return;
}

Assistant:

void
MLNodeLaplacian::prepareForSolve ()
{
    BL_PROFILE("MLNodeLaplacian::prepareForSolve()");

    MLNodeLinOp::prepareForSolve();

    buildMasks();

    averageDownCoeffs();

#ifdef AMREX_USE_EB
    buildIntegral();
    if (m_build_surface_integral) buildSurfaceIntegral();
#endif

    buildStencil();
}